

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_iterate(run_container_t *cont,uint32_t base,roaring_iterator iterator,void *ptr)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  long lVar7;
  bool local_49;
  
  local_49 = cont->n_runs < 1;
  if (0 < cont->n_runs) {
    lVar7 = 0;
    do {
      uVar1 = cont->runs[lVar7].value;
      uVar2 = cont->runs[lVar7].length;
      _Var3 = (*iterator)(base + uVar1,ptr);
      if (!_Var3) {
        return local_49;
      }
      uVar6 = (uint)uVar1 + base + 1;
      uVar5 = (uint)uVar2;
      uVar4 = 0;
      do {
        if (-uVar5 == uVar4) goto LAB_00117268;
        _Var3 = (*iterator)(uVar6,ptr);
        uVar4 = uVar4 - 1;
        uVar6 = uVar6 + 1;
      } while (_Var3);
      if (~uVar4 < uVar5) {
        return local_49;
      }
LAB_00117268:
      lVar7 = lVar7 + 1;
      local_49 = cont->n_runs <= lVar7;
    } while (lVar7 < cont->n_runs);
  }
  return local_49;
}

Assistant:

bool run_container_iterate(const run_container_t *cont, uint32_t base,
                           roaring_iterator iterator, void *ptr) {
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;

        for (int j = 0; j <= le; ++j)
            if (!iterator(run_start + j, ptr)) return false;
    }
    return true;
}